

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

void __thiscall ANN::addLayer(ANN *this,int size,string *type)

{
  int iVar1;
  pointer pcVar2;
  long lVar3;
  Filter *pFVar4;
  _Alloc_hider _Var5;
  Filter *local_78;
  string local_70;
  string local_50;
  
  this->outputSize = size;
  lVar3 = std::__cxx11::string::rfind((char *)type,0x11a1f8,0);
  if (((lVar3 == 0) || (lVar3 = std::__cxx11::string::rfind((char *)type,0x11a200,0), lVar3 == 0))
     || (lVar3 = std::__cxx11::string::rfind((char *)type,0x11a209,0), lVar3 == 0)) {
    pFVar4 = (Filter *)operator_new(0xa0);
    iVar1 = this->inputSize;
    pcVar2 = (type->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + type->_M_string_length);
    Filter::Filter(pFVar4,iVar1,size,&this->learning_rate,&local_50);
    local_78 = pFVar4;
    std::vector<Layer*,std::allocator<Layer*>>::emplace_back<Layer*>
              ((vector<Layer*,std::allocator<Layer*>> *)this,(Layer **)&local_78);
    _Var5._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  else {
    pFVar4 = (Filter *)operator_new(0x90);
    iVar1 = this->inputSize;
    pcVar2 = (type->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + type->_M_string_length);
    Dense::Dense((Dense *)pFVar4,iVar1,size,&this->learning_rate,&local_70);
    local_78 = pFVar4;
    std::vector<Layer*,std::allocator<Layer*>>::emplace_back<Layer*>
              ((vector<Layer*,std::allocator<Layer*>> *)this,(Layer **)&local_78);
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var5._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
  }
  operator_delete(_Var5._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void ANN::addLayer(int size, string type) {
    outputSize = size;
    if(type.rfind("lowpass", 0) == 0 || type.rfind("highpass", 0) == 0 || type.rfind("passband", 0) == 0) {
        layers.push_back(new Filter(inputSize, size, &learning_rate, type));
    }
    else {
        layers.push_back(new Dense(inputSize, size, &learning_rate, type));
    }
}